

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_klass_table.hpp
# Opt level: O3

weak_ptr<squall::detail::KlassImp<Foo>_> __thiscall
squall::KlassTable::add_klass<Foo,void>(KlassTable *this,HSQUIRRELVM vm,string *name)

{
  iterator iVar1;
  __buckets_ptr pp_Var2;
  mapped_type *pmVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  __buckets_ptr pp_Var5;
  bool bVar6;
  undefined1 auVar7 [16];
  weak_ptr<squall::detail::KlassImp<Foo>_> wVar8;
  shared_ptr<squall::detail::KlassImp<Foo>_> p;
  size_t h;
  undefined1 local_49;
  KlassImp<Foo> *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  size_t local_38;
  SQVM *local_30;
  
  local_38 = std::type_info::hash_code((type_info *)&detail::KlassImp<Foo>::typeinfo);
  iVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)vm,&local_38);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    local_48 = (KlassImp<Foo> *)0x0;
    local_30 = (SQVM *)name;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<squall::detail::KlassImp<Foo>,std::allocator<squall::detail::KlassImp<Foo>>,SQVM*&,std::__cxx11::string_const&>
              (&local_40,&local_48,(allocator<squall::detail::KlassImp<Foo>_> *)&local_49,&local_30,
               in_RCX);
    pmVar3 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)vm,&local_38);
    (pmVar3->super___shared_ptr<squall::detail::KlassImpBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         &local_48->super_KlassImpBase;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar3->
                super___shared_ptr<squall::detail::KlassImpBase,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount,&local_40);
    (this->klasses_)._M_h._M_buckets = (__buckets_ptr)local_48;
    (this->klasses_)._M_h._M_bucket_count = (size_type)local_40._M_pi;
    _Var4._M_pi = extraout_RDX_00;
    if (local_40._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0010752b;
    if (__libc_single_threaded != '\0') goto LAB_0010750e;
    LOCK();
    (local_40._M_pi)->_M_weak_count = (local_40._M_pi)->_M_weak_count + 1;
    UNLOCK();
    if (local_40._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0010752b;
LAB_00107511:
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
    _Var4._M_pi = extraout_RDX_01;
  }
  else {
    if (*(long *)((long)iVar1.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_false>
                        ._M_cur + 0x10) == 0) {
      _Var4._M_pi = extraout_RDX;
      pp_Var5 = (__buckets_ptr)0x0;
    }
    else {
      auVar7 = __dynamic_cast(*(long *)((long)iVar1.
                                              super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_false>
                                              ._M_cur + 0x10),&detail::KlassImpBase::typeinfo,
                              &detail::KlassImp<Foo>::typeinfo,0);
      _Var4._M_pi = auVar7._8_8_;
      pp_Var2 = auVar7._0_8_;
      pp_Var5 = (__buckets_ptr)0x0;
      if ((pp_Var2 != (__buckets_ptr)0x0) &&
         (local_40._M_pi =
               *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)iVar1.
                       super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_false>
                       ._M_cur + 0x18), pp_Var5 = pp_Var2,
         local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
          UNLOCK();
          bVar6 = __libc_single_threaded == '\0';
          (this->klasses_)._M_h._M_buckets = pp_Var2;
          (this->klasses_)._M_h._M_bucket_count = (size_type)local_40._M_pi;
          if (bVar6) {
            LOCK();
            (local_40._M_pi)->_M_weak_count = (local_40._M_pi)->_M_weak_count + 1;
            UNLOCK();
            goto LAB_00107511;
          }
        }
        else {
          (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
          (this->klasses_)._M_h._M_buckets = pp_Var2;
          (this->klasses_)._M_h._M_bucket_count = (size_type)local_40._M_pi;
        }
LAB_0010750e:
        (local_40._M_pi)->_M_weak_count = (local_40._M_pi)->_M_weak_count + 1;
        goto LAB_00107511;
      }
    }
    (this->klasses_)._M_h._M_buckets = pp_Var5;
    (this->klasses_)._M_h._M_bucket_count = 0;
  }
LAB_0010752b:
  wVar8.super___weak_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  wVar8.super___weak_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (weak_ptr<squall::detail::KlassImp<Foo>_>)
         wVar8.super___weak_ptr<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::weak_ptr<detail::KlassImp<typename std::remove_cv<C>::type>>
    add_klass(HSQUIRRELVM vm, const string& name) {
        typedef typename std::remove_cv<C>::type CC;
        size_t h = detail::KlassImp<CC>::hash();
        auto i = klasses_.find(h);
        if (i == klasses_.end()) {
            auto p = KlassAdd<CC, Base>::doit(klasses_, vm, name);
            klasses_[h] = p;
            return p;
        } else {
            return std::dynamic_pointer_cast<detail::KlassImp<CC>>(
                (*i).second);
        }
    }